

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O1

void __thiscall celero::Experiment::Experiment(Experiment *this)

{
  _Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_> _Var1
  ;
  
  _Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl =
       (_Head_base<0UL,_celero::Experiment::Impl_*,_false>)operator_new(0x90);
  *(undefined8 *)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 **)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x38) =
       (undefined8 *)
       ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x48);
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined1 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x78) = 1;
  *(undefined8 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined1 *)
   ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl + 0x88) = 0;
  (this->pimpl)._pimpl._M_t.
  super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
  .super__Head_base<0UL,_celero::Experiment::Impl_*,_false> =
       _Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl;
  return;
}

Assistant:

Experiment::Experiment() : pimpl()
{
}